

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O3

void RangeDec_Decode(CPpmd8 *p,UInt32 start,UInt32 size)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  
  iVar4 = start * p->Range;
  uVar3 = p->Code - iVar4;
  uVar5 = iVar4 + p->Low;
  p->Low = uVar5;
  p->Code = uVar3;
  uVar2 = size * p->Range;
  p->Range = uVar2;
  do {
    if (0xffffff < (uVar5 + uVar2 ^ uVar5)) {
      if (0x7fff < uVar2) {
        return;
      }
      p->Range = -uVar5 & 0x7fff;
    }
    bVar1 = (*((p->Stream).In)->Read)((p->Stream).In);
    uVar3 = uVar3 << 8 | (uint)bVar1;
    p->Code = uVar3;
    uVar2 = p->Range << 8;
    p->Range = uVar2;
    uVar5 = p->Low << 8;
    p->Low = uVar5;
  } while( true );
}

Assistant:

static void RangeDec_Decode(CPpmd8 *p, UInt32 start, UInt32 size)
{
  start *= p->Range;
  p->Low += start;
  p->Code -= start;
  p->Range *= size;

  while ((p->Low ^ (p->Low + p->Range)) < kTop ||
      (p->Range < kBot && ((p->Range = (0 - p->Low) & (kBot - 1)), 1)))
  {
    p->Code = (p->Code << 8) | p->Stream.In->Read(p->Stream.In);
    p->Range <<= 8;
    p->Low <<= 8;
  }
}